

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

_Bool is_a_vowel(wchar_t ch)

{
  int iVar1;
  _Bool local_9;
  wchar_t ch_local;
  
  iVar1 = tolower(ch & 0xff);
  if ((((iVar1 == 0x61) || (iVar1 == 0x65)) || (iVar1 == 0x69)) ||
     ((iVar1 == 0x6f || (iVar1 == 0x75)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool is_a_vowel(int ch)
{
	switch (tolower((unsigned char) ch))
	{
		case 'a':
		case 'e':
		case 'i':
		case 'o':
		case 'u':
		{
			return (true);
		}
	}

	return (false);
}